

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

void __thiscall
bwtil::IndexedBWT::IndexedBWT(IndexedBWT *this,string *BWT,ulint sample_rate,bool verbose)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  byte bVar4;
  uint uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  void *this_00;
  undefined1 *puVar8;
  size_type sVar9;
  ulong uVar10;
  byte *pbVar11;
  reference pvVar12;
  value_type *pvVar13;
  reference pvVar14;
  succinct_bitvector *psVar15;
  byte in_CL;
  uint uVar16;
  ulong in_RDX;
  ulong in_RSI;
  uint *in_RDI;
  undefined1 auVar17 [64];
  reference rVar18;
  vector<bool,_std::allocator<bool>_> mark_pos;
  ulint i_8;
  uint i_7;
  int i_6;
  uint i_5;
  ulint i_4;
  ulint i_3;
  uint i_2;
  uint i_1;
  ulint i;
  vector<bool,_std::allocator<bool>_> char_inserted;
  vector<unsigned_char,_std::allocator<unsigned_char>_> alphabet;
  ulint nr_of_terminators;
  succinct_bitvector *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  value_type in_stack_fffffffffffffbe7;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffbe8;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffbf0;
  size_type in_stack_fffffffffffffbf8;
  WaveletTree *in_stack_fffffffffffffc00;
  value_type vVar19;
  size_t in_stack_fffffffffffffc08;
  packed_view<std::vector> *in_stack_fffffffffffffc10;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  undefined1 *puVar20;
  undefined1 verbose_00;
  undefined4 in_stack_fffffffffffffc30;
  vector<bool,_std::allocator<bool>_> *vb;
  succinct_bitvector *this_02;
  undefined1 verbose_01;
  undefined7 in_stack_fffffffffffffc88;
  value_type in_stack_fffffffffffffc8f;
  undefined8 in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  WaveletTree *this_03;
  long local_2e0;
  ulong local_218;
  uint local_20c;
  int local_208;
  uint local_204;
  ulong local_200;
  undefined1 local_1d0 [48];
  vector<bool,_std::allocator<bool>_> local_1a0 [2];
  succinct_bitvector local_140;
  uchar *local_e0;
  uchar *local_d8;
  reference local_d0;
  undefined1 local_b9;
  reference local_b8;
  ulong local_a8;
  undefined1 local_99;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  undefined1 local_51;
  WaveletTree local_50;
  byte local_19;
  ulong local_18;
  ulong local_10;
  undefined1 extraout_var [56];
  
  local_19 = in_CL & 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  WaveletTree::WaveletTree((WaveletTree *)0x14544b);
  succinct_bitvector::succinct_bitvector
            ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  bv::internal::packed_view<std::vector>::packed_view
            ((packed_view<std::vector> *)
             CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x14549e);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1454ba);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1454d6);
  uVar6 = std::__cxx11::string::length();
  *(undefined8 *)(in_RDI + 2) = uVar6;
  *(ulong *)(in_RDI + 6) = local_18;
  if (local_18 == 0) {
    local_2e0 = 0;
  }
  else {
    local_2e0 = *(ulong *)(in_RDI + 2) / local_18 + 1;
  }
  *(long *)(in_RDI + 8) = local_2e0;
  if ((local_19 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout," Building indexed BWT data structure");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  if ((local_19 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"  Number of sampled SA pointers = ");
    this_00 = (void *)std::ostream::operator<<(poVar7,*(ulong *)(in_RDI + 8));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  auVar17._0_8_ = std::log2<unsigned_long>(0x145631);
  auVar17._8_56_ = extraout_var;
  auVar2 = vroundsd_avx(auVar17._0_16_,auVar17._0_16_,10);
  uVar16 = vcvttsd2usi_avx512f(auVar2);
  in_RDI[10] = uVar16;
  if (in_RDI[10] == 0) {
    in_RDI[10] = 1;
  }
  local_50.nodes.
  super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_51 = 0;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x14568a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8,in_stack_fffffffffffffbf0._M_current,
             (allocator_type *)in_stack_fffffffffffffbe8._M_current);
  this_03 = &local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffbf0._M_current,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffbe8._M_current);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffbf0._M_current);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1456ec);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1456f9);
  local_99 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x145716);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)in_stack_fffffffffffffc00,
             in_stack_fffffffffffffbf8,(bool *)in_stack_fffffffffffffbf0._M_current,
             (allocator_type *)in_stack_fffffffffffffbe8._M_current);
  std::allocator<bool>::~allocator((allocator<bool> *)0x145747);
  for (local_a8 = 0; local_a8 < *(ulong *)(in_RDI + 2); local_a8 = local_a8 + 1) {
    in_stack_fffffffffffffce8 = (string *)std::__cxx11::string::at(local_10);
    if (*in_stack_fffffffffffffce8 == (string)0x0) {
      *(ulong *)(in_RDI + 4) = local_a8;
      local_50.nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((long)&(local_50.nodes.
                             super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->n + 1);
    }
    else {
      in_stack_fffffffffffffce0 = std::__cxx11::string::at(local_10);
      rVar18 = std::vector<bool,_std::allocator<bool>_>::at
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                          (size_type)in_stack_fffffffffffffbd8);
      local_b8 = rVar18;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        puVar8 = (undefined1 *)std::__cxx11::string::at(local_10);
        local_b9 = *puVar8;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                   (value_type_conflict1 *)in_stack_fffffffffffffbd8);
        std::__cxx11::string::at(local_10);
        rVar18 = std::vector<bool,_std::allocator<bool>_>::at
                           ((vector<bool,_std::allocator<bool>_> *)
                            CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                            (size_type)in_stack_fffffffffffffbd8);
        local_d0 = rVar18;
        std::_Bit_reference::operator=(&local_d0,true);
      }
    }
  }
  if (local_50.nodes.
      super__Vector_base<bwtil::succinct_bitvector,_std::allocator<bwtil::succinct_bitvector>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x1) {
    sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_70);
    *in_RDI = (uint)sVar9;
    local_d8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffbd8);
    local_e0 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   in_stack_fffffffffffffbd8);
    std::
    sort<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8);
    local_140._92_4_ = 0;
    while( true ) {
      uVar10 = (ulong)(uint)local_140._92_4_;
      sVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_70);
      if (sVar9 <= uVar10) break;
      in_stack_fffffffffffffc8f = local_140._92_1_;
      pbVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                           (size_type)in_stack_fffffffffffffbd8);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x42),
                           (ulong)*pbVar11);
      *pvVar12 = in_stack_fffffffffffffc8f;
      local_140._92_4_ = local_140._92_4_ + 1;
    }
    puVar8 = (undefined1 *)
             ((long)&local_140.rank_ptrs_2.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + 7);
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x145afa);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc00,
               in_stack_fffffffffffffbf8,(allocator_type *)in_stack_fffffffffffffbf0._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffbf0._M_current,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffbe8._M_current);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffbf0._M_current);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x145b4f);
    for (local_140.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
         _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
        (uint)local_140.rank_ptrs_2.
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start < *in_RDI;
        local_140.rank_ptrs_2.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
        _M_impl.super__Vector_impl_data._M_start._0_4_ =
             (uint)local_140.rank_ptrs_2.
                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                   super__Vector_impl_data._M_start + 1) {
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
                           (size_type)in_stack_fffffffffffffbd8);
      vVar1 = *pvVar12;
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x48),
                           (ulong)(uint)local_140.rank_ptrs_2.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
      *pvVar12 = vVar1;
    }
    for (local_140.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_140.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage < *(pointer *)(in_RDI + 2);
        local_140.rank_ptrs_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)local_140.rank_ptrs_1.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
      pbVar11 = (byte *)std::__cxx11::string::at(local_10);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x42),
                           (ulong)*pbVar11);
      vVar1 = *pvVar12;
      pvVar13 = (value_type *)std::__cxx11::string::at(local_10);
      *pvVar13 = vVar1;
    }
    WaveletTree::WaveletTree
              (this_03,in_stack_fffffffffffffce8,SUB81((ulong)in_stack_fffffffffffffce0 >> 0x38,0));
    this_02 = &local_140;
    WaveletTree::operator=
              ((WaveletTree *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               (WaveletTree *)in_stack_fffffffffffffbd8);
    WaveletTree::~WaveletTree((WaveletTree *)0x145d09);
    succinct_bitvector::succinct_bitvector
              ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
    vb = local_1a0;
    succinct_bitvector::operator=
              ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbd8);
    succinct_bitvector::~succinct_bitvector
              ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0));
    bv::internal::packed_view<std::vector>::packed_view
              (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,(size_t)in_stack_fffffffffffffc00
              );
    puVar20 = local_1d0;
    bv::internal::packed_view<std::vector>::operator=
              ((packed_view<std::vector> *)
               CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0),
               (packed_view<std::vector> *)in_stack_fffffffffffffbd8);
    bv::internal::packed_view<std::vector>::~packed_view((packed_view<std::vector> *)0x145d8b);
    uVar5 = WaveletTree::bitsPerSymbol((WaveletTree *)(in_RDI + 0xc));
    in_RDI[1] = uVar5;
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x145dcf);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffc00,
               in_stack_fffffffffffffbf8,(value_type *)in_stack_fffffffffffffbf0._M_current,
               (allocator_type *)in_stack_fffffffffffffbe8._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffbf0._M_current,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffbe8._M_current);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               in_stack_fffffffffffffbf0._M_current);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x145e26);
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                         0xff);
    *pvVar14 = 0;
    for (local_200 = 0; local_200 < *(ulong *)(in_RDI + 2); local_200 = local_200 + 1) {
      if (local_200 != *(ulong *)(in_RDI + 4)) {
        this_01 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c);
        bVar4 = WaveletTree::charAt(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
        pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            (this_01,(ulong)bVar4);
        *pvVar14 = *pvVar14 + 1;
      }
    }
    for (local_204 = 1; local_204 < 0xff; local_204 = local_204 + 1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                           (ulong)(local_204 - 1));
      vVar19 = *pvVar14;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                           (ulong)local_204);
      *pvVar14 = vVar19 + *pvVar14;
    }
    for (local_208 = 0xfe; 0 < local_208; local_208 = local_208 + -1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                           (long)(local_208 + -1));
      vVar19 = *pvVar14;
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                           (long)local_208);
      *pvVar14 = vVar19;
    }
    pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),0)
    ;
    *pvVar14 = 0;
    for (local_20c = 0; local_20c < 0xff; local_20c = local_20c + 1) {
      pvVar14 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x3c),
                           (ulong)local_20c);
      *pvVar14 = *pvVar14 + 1;
    }
    local_218 = 0;
    while( true ) {
      verbose_00 = (undefined1)((ulong)puVar20 >> 0x38);
      verbose_01 = (undefined1)((ulong)puVar8 >> 0x38);
      if (*(ulong *)(in_RDI + 2) <= local_218) break;
      in_stack_fffffffffffffbf0._M_current = (uchar *)(in_RDI + 0x48);
      pbVar11 = (byte *)std::__cxx11::string::at(local_10);
      pvVar12 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           in_stack_fffffffffffffbf0._M_current,(ulong)*pbVar11);
      in_stack_fffffffffffffbe7 = *pvVar12;
      pvVar13 = (value_type *)std::__cxx11::string::at(local_10);
      *pvVar13 = in_stack_fffffffffffffbe7;
      local_218 = local_218 + 1;
    }
    psVar15 = (succinct_bitvector *)std::__cxx11::string::at(local_10);
    *(undefined1 *)&psVar15->n = 0;
    if (local_18 != 0) {
      if ((local_19 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"\n  Marking positions containing a SA pointer ... ");
      }
      markPositions((IndexedBWT *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                    (bool)verbose_01);
      succinct_bitvector::succinct_bitvector(this_02,vb);
      succinct_bitvector::operator=
                ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                 ,psVar15);
      succinct_bitvector::~succinct_bitvector
                ((succinct_bitvector *)CONCAT17(in_stack_fffffffffffffbe7,in_stack_fffffffffffffbe0)
                );
      if ((local_19 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"  Done.\n");
      }
      if ((local_19 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"\n  Sampling SA pointers ... ");
      }
      sampleSA((IndexedBWT *)CONCAT44(uVar5,in_stack_fffffffffffffc30),(bool)verbose_00);
      if ((local_19 & 1) != 0) {
        std::operator<<((ostream *)&std::cout,"  Done.\n");
      }
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x146286);
    }
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x146293);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               in_stack_fffffffffffffbf0._M_current);
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n");
  exit(1);
}

Assistant:

IndexedBWT(string &BWT, ulint sample_rate, bool verbose=false){

		this->n=BWT.length();
		this->offrate=sample_rate;

		number_of_SA_pointers = (sample_rate==0?0:n/sample_rate + 1);

		if(verbose) cout << " Building indexed BWT data structure" << endl;
		if(verbose) cout << "  Number of sampled SA pointers = " << number_of_SA_pointers << endl;

		w = ceil(log2(n));
		if(w<1) w=1;

		ulint nr_of_terminators=0;

		//compute re-mapping to keep alphabet size to a minimum
		//from text chars -> to integers in {0,...,sigma}. the 0x0 byte is also remapped in 0x0, as the first alphabet character.
		remapping = vector<uchar>(256,0);

		//detect alphabet
		vector<uchar> alphabet;
		vector<bool> char_inserted = vector<bool>(256,false);

		for(ulint i=0;i<n;i++){

			if((uchar)BWT.at(i)==0){//found terminator. Save position
				terminator_position = i;
				nr_of_terminators++;
			}else{

				if(not char_inserted.at((uchar)BWT.at(i))){

					alphabet.push_back((uchar)BWT.at(i));
					char_inserted.at((uchar)BWT.at(i))=true;

				}

			}
		}

		if(nr_of_terminators!=1){

			cout << "Error (IndexedBWT.cpp): the bwt contains no o more than one 0x0 bytes\n";
			exit(1);

		}

		sigma = alphabet.size();

		//sort alphabet

		std::sort(alphabet.begin(),alphabet.end());

		//calculate remapping
		//note: remapping of terminator (0x0) is 0

		for(uint i=0;i<alphabet.size();i++)
			remapping[alphabet.at(i)] = i;

		//calculate inverse remapping

		inverse_remapping = vector<uchar>(sigma);

		for(uint i=0;i<sigma;i++)
			inverse_remapping[i] = alphabet.at(i);

		//apply remapping

		for(ulint i=0;i<n;i++)
			BWT.at(i) = remapping[(uchar)BWT.at(i)];

		bwt_wt =  WaveletTree(BWT,verbose);

		marked_positions =  succinct_bitvector();

		text_pointers =  packed_view_t(w,number_of_SA_pointers);

		log_sigma = bwt_wt.bitsPerSymbol();

		FIRST = vector<ulint>(256,0);

		FIRST[TERMINATOR]=0;//first occurrence of terminator char in the first column is at the beginning

		//count number of occurrences of each character
		for(ulint i=0;i<n;i++)
			if(i!=terminator_position)
				FIRST[bwt_wt.charAt(i)]++;

		for(uint i=1;i<255;i++)
			FIRST[i] += FIRST[i-1];

		for(int i=254;i>0;i--)
			FIRST[i] = FIRST[i-1];

		FIRST[0] = 0;

		for(uint i=0;i<255;i++)
			FIRST[i]++;

		//restore original values in BWT
		for(ulint i=0;i<n;i++)
			BWT.at(i) = inverse_remapping[(uchar)BWT.at(i)];

		BWT.at(terminator_position) = 0;

		if(sample_rate>0){
			if(verbose) cout << "\n  Marking positions containing a SA pointer ... ";

			vector<bool> mark_pos = markPositions(verbose);
			marked_positions = succinct_bitvector( mark_pos );

			if(verbose) cout << "  Done.\n";

			if(verbose) cout << "\n  Sampling SA pointers ... ";
			sampleSA(verbose);
			if(verbose) cout << "  Done.\n";
		}

	}